

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::write_ptr<char,std::back_insert_iterator<std::__cxx11::string>,unsigned_long>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,unsigned_long value,basic_format_specs<char> *specs)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out_00;
  int value_00;
  char *pcVar1;
  long in_RDX;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  anon_class_16_2_92d121e5 write;
  size_t size;
  int num_digits;
  iterator in_stack_ffffffffffffffa8;
  anon_class_16_2_92d121e5 *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffcc;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_10.container = in_RDI;
  value_00 = count_digits<4u,unsigned_long>((unsigned_long)in_RSI.container);
  to_unsigned<int>(value_00);
  if (in_RDX == 0) {
    reserve<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (in_RSI,in_stack_ffffffffffffffb8);
    pcVar1 = write_ptr<char,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long>
             ::anon_class_16_2_92d121e5::operator()
                       ((anon_class_16_2_92d121e5 *)local_10.container,in_stack_ffffffffffffffa8);
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              base_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_10,pcVar1);
  }
  else {
    out_00.container._4_4_ = in_stack_ffffffffffffffcc;
    out_00.container._0_4_ = value_00;
    local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_ptr<char,std::back_insert_iterator<std::__cxx11::string>,unsigned_long>(std::back_insert_iterator<std::__cxx11::string>,unsigned_long,fmt::v7::basic_format_specs<char>const*)::_lambda(char*)_1_&>
                        (out_00,in_RSI.container,local_10.container,in_stack_ffffffffffffffb0);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )local_8;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}